

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<MyTestType,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
          (View<MyTestType,false,std::allocator<unsigned_long>> *this,unsigned_long *bit,
          unsigned_long *sit,View<MyTestType,_false,_std::allocator<unsigned_long>_> *out)

{
  CoordinateOrder *internalCoordinateOrder;
  View<MyTestType,_false,_std::allocator<unsigned_long>_> *out_local;
  unsigned_long *sit_local;
  unsigned_long *bit_local;
  View<MyTestType,_false,_std::allocator<unsigned_long>_> *this_local;
  
  internalCoordinateOrder =
       View<MyTestType,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                 ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  view<unsigned_long*,unsigned_long*>(this,bit,sit,internalCoordinateOrder,out);
  return;
}

Assistant:

inline void
View<T, isConst, A>::view
(
    BaseIterator bit,
    ShapeIterator sit,
    View<T, isConst, A>& out
) const
{
    view(bit, sit, coordinateOrder(), out);
}